

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_lpc_swb.c
# Opt level: O1

int16_t WebRtcIsac_AddLarMean(double *data,int16_t bandwidth)

{
  double *pdVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  undefined6 in_register_00000032;
  long lVar5;
  
  iVar4 = (int)CONCAT62(in_register_00000032,bandwidth);
  if (iVar4 == 0xc) {
    pdVar1 = WebRtcIsac_kMeanLarUb12;
    sVar2 = 2;
  }
  else {
    if (iVar4 != 0x10) {
      return -1;
    }
    pdVar1 = WebRtcIsac_kMeanLarUb16;
    sVar2 = 4;
  }
  sVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(double *)((long)data + lVar5) =
           *(double *)((long)pdVar1 + lVar5) + *(double *)((long)data + lVar5);
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x20);
    sVar3 = sVar3 + 1;
    data = data + 4;
  } while (sVar3 < sVar2);
  return 0;
}

Assistant:

int16_t
WebRtcIsac_AddLarMean(
    double* data,
    int16_t bandwidth)
{
  int16_t coeffCntr;
  int16_t vecCntr;
  int16_t numVec;
  const double* meanLAR;

  switch(bandwidth)
  {
    case isac12kHz:
      {
        numVec = UB_LPC_VEC_PER_FRAME;
        meanLAR = WebRtcIsac_kMeanLarUb12;
        break;
      }
    case isac16kHz:
      {
        numVec = UB16_LPC_VEC_PER_FRAME;
        meanLAR = WebRtcIsac_kMeanLarUb16;
        break;
      }
    default:
      return -1;
  }

  for(vecCntr = 0; vecCntr < numVec; vecCntr++)
  {
    for(coeffCntr = 0; coeffCntr < UB_LPC_ORDER; coeffCntr++)
    {
      *data++ += meanLAR[coeffCntr];
    }
  }
  return 0;
}